

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::makeIntegerIndex(HlslParseContext *this,TIntermTyped *index)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType local_c0;
  int local_28;
  int local_24;
  int vecSize;
  TBasicType indexBasicType;
  TIntermTyped *index_local;
  HlslParseContext *this_local;
  
  _vecSize = (HlslParseContext *)index;
  index_local = (TIntermTyped *)this;
  iVar1 = (*(index->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  local_24 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))();
  iVar1 = (*(_vecSize->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])();
  local_28 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x60))();
  if ((((local_24 == 8) || (local_24 == 9)) || (local_24 == 10)) || (local_24 == 0xb)) {
    this_local = _vecSize;
  }
  else {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TType::TType(&local_c0,EbtUint,EvqTemporary,local_28,0,0,false);
    this_local = (HlslParseContext *)
                 TIntermediate::addConversion
                           (this_00,EOpConstructUint,&local_c0,(TIntermTyped *)_vecSize);
    TType::~TType(&local_c0);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::makeIntegerIndex(TIntermTyped* index)
{
    const TBasicType indexBasicType = index->getType().getBasicType();
    const int vecSize = index->getType().getVectorSize();

    // We can use int types directly as the index
    if (indexBasicType == EbtInt || indexBasicType == EbtUint ||
        indexBasicType == EbtInt64 || indexBasicType == EbtUint64)
        return index;

    // Cast index to unsigned integer if it isn't one.
    return intermediate.addConversion(EOpConstructUint, TType(EbtUint, EvqTemporary, vecSize), index);
}